

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O0

sub_channel_info *
idx2::BinarySearch<idx2::sub_channel_info,idx2::sub_channel_info*>
          (sub_channel_info *Beg,sub_channel_info *End,sub_channel_info *Val)

{
  bool bVar1;
  undefined1 auVar2 [16];
  sub_channel_info *psVar3;
  sub_channel_info *Mid;
  sub_channel_info *Val_local;
  sub_channel_info *End_local;
  sub_channel_info *Beg_local;
  
  Val_local = End;
  End_local = Beg;
  do {
    while( true ) {
      if (Val_local <= End_local) {
        return Val_local;
      }
      auVar2._8_8_ = (long)Val_local - (long)End_local >> 0x3f;
      auVar2._0_8_ = (long)Val_local - (long)End_local >> 4;
      psVar3 = End_local + SUB168(auVar2 / SEXT816(2),0);
      if (psVar3->Level == Val->Level) {
        bVar1 = psVar3->Subband < Val->Subband;
      }
      else {
        bVar1 = Val->Level < psVar3->Level;
      }
      if (!bVar1) break;
      End_local = psVar3 + 1;
    }
    if (Val->Level == psVar3->Level) {
      bVar1 = Val->Subband < psVar3->Subband;
    }
    else {
      bVar1 = psVar3->Level < Val->Level;
    }
    Val_local = psVar3;
  } while (bVar1);
  return psVar3;
}

Assistant:

i
BinarySearch(i Beg, i End, const t& Val)
{
  while (Beg < End)
  {
    i Mid = Beg + (End - Beg) / 2;
    if (*Mid < Val)
    {
      Beg = Mid + 1;
      continue;
    }
    else if (Val < *Mid)
    {
      End = Mid;
      continue;
    }
    return Mid;
  }
  return End;
}